

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void roaring_bitmap_add(roaring_bitmap_t *r,uint32_t val)

{
  uint8_t typecode_00;
  ushort uVar1;
  int iVar2;
  uint16_t *puVar3;
  uint8_t *puVar4;
  bool bVar5;
  shared_container_t *sc;
  container_t *pcVar6;
  undefined8 *c;
  container_t *pcVar7;
  uint unaff_EBP;
  uint uVar8;
  int iVar9;
  ushort key;
  uint uVar10;
  uint8_t newtypecode;
  uint8_t typecode;
  uint8_t local_2a;
  uint8_t local_29;
  
  iVar2 = (r->high_low_container).size;
  key = (ushort)(val >> 0x10);
  if (((long)iVar2 == 0) || (puVar3 = (r->high_low_container).keys, puVar3[(long)iVar2 + -1] == key)
     ) {
    uVar8 = iVar2 - 1;
  }
  else {
    iVar9 = iVar2 + -1;
    uVar10 = 0;
    do {
      if (iVar9 < (int)uVar10) {
        uVar8 = ~uVar10;
        break;
      }
      uVar8 = uVar10 + iVar9 >> 1;
      uVar1 = *(ushort *)((long)puVar3 + (ulong)(uVar10 + iVar9 & 0xfffffffe));
      if (uVar1 < key) {
        uVar10 = uVar8 + 1;
        bVar5 = true;
        uVar8 = unaff_EBP;
      }
      else if (key < uVar1) {
        iVar9 = uVar8 - 1;
        bVar5 = true;
        uVar8 = unaff_EBP;
      }
      else {
        bVar5 = false;
      }
      unaff_EBP = uVar8;
    } while (bVar5);
  }
  if ((int)uVar8 < 0) {
    c = (undefined8 *)malloc(0x10);
    if (c == (undefined8 *)0x0) {
      c = (undefined8 *)0x0;
    }
    else {
      *c = 0;
      c[1] = 0;
    }
    pcVar7 = container_add(c,(uint16_t)val,'\x02',&local_29);
    ra_insert_new_key_value_at(&r->high_low_container,~uVar8,key,pcVar7,local_29);
    return;
  }
  if (iVar2 <= (int)(uVar8 & 0xffff)) {
    __assert_fail("i < ra->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x1a95,"void ra_unshare_container_at_index(roaring_array_t *, uint16_t)");
  }
  uVar10 = uVar8 & 0xffff;
  puVar4 = (r->high_low_container).typecodes;
  sc = (shared_container_t *)(r->high_low_container).containers[uVar10];
  if (puVar4[uVar10] == '\x04') {
    sc = (shared_container_t *)shared_container_extract_copy(sc,puVar4 + uVar10);
  }
  *(shared_container_t **)((long)(r->high_low_container).containers + (ulong)(uVar10 * 8)) = sc;
  typecode_00 = (r->high_low_container).typecodes[uVar10];
  pcVar7 = *(container_t **)((long)(r->high_low_container).containers + (ulong)(uVar10 * 8));
  local_2a = typecode_00;
  local_29 = typecode_00;
  pcVar6 = container_add(pcVar7,(uint16_t)val,typecode_00,&local_2a);
  if (pcVar6 != pcVar7) {
    container_free(pcVar7,typecode_00);
    if ((r->high_low_container).size <= (int)uVar8) {
      __assert_fail("i < ra->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x1a3a,
                    "void ra_set_container_at_index(const roaring_array_t *, int32_t, container_t *, uint8_t)"
                   );
    }
    (r->high_low_container).containers[uVar8] = pcVar6;
    (r->high_low_container).typecodes[uVar8] = local_2a;
  }
  return;
}

Assistant:

void roaring_bitmap_add(roaring_bitmap_t *r, uint32_t val) {
    roaring_array_t *ra = &r->high_low_container;

    const uint16_t hb = val >> 16;
    const int i = ra_get_index(ra, hb);
    uint8_t typecode;
    if (i >= 0) {
        ra_unshare_container_at_index(ra, i);
        container_t *container =
            ra_get_container_at_index(ra, i, &typecode);
        uint8_t newtypecode = typecode;
        container_t *container2 =
            container_add(container, val & 0xFFFF, typecode, &newtypecode);
        if (container2 != container) {
            container_free(container, typecode);
            ra_set_container_at_index(&r->high_low_container, i, container2,
                                      newtypecode);
        }
    } else {
        array_container_t *newac = array_container_create();
        container_t *container = container_add(newac, val & 0xFFFF,
                                        ARRAY_CONTAINER_TYPE, &typecode);
        // we could just assume that it stays an array container
        ra_insert_new_key_value_at(&r->high_low_container, -i - 1, hb,
                                   container, typecode);
    }
}